

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O0

void __thiscall
Js::JavascriptExceptionContext::StackFrame::StackFrame
          (StackFrame *this,JavascriptFunction *func,JavascriptStackWalker *walker,
          bool initArgumentTypes)

{
  uint32 uVar1;
  FunctionBody *ptr;
  FunctionBody **ppFVar2;
  PCWSTR ptr_00;
  bool initArgumentTypes_local;
  JavascriptStackWalker *walker_local;
  JavascriptFunction *func_local;
  StackFrame *this_local;
  
  Memory::WriteBarrierPtr<Js::FunctionBody>::WriteBarrierPtr(&this->functionBody);
  StackTraceArguments::StackTraceArguments(&this->argumentTypes);
  ptr = JavascriptFunction::GetFunctionBody(func);
  Memory::WriteBarrierPtr<Js::FunctionBody>::operator=(&this->functionBody,ptr);
  ppFVar2 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__((WriteBarrierPtr *)this);
  if (*ppFVar2 == (FunctionBody *)0x0) {
    ptr_00 = JavascriptStackWalker::GetCurrentNativeLibraryEntryName(walker);
    Memory::WriteBarrierPtr<const_char16_t>::operator=(&(this->field_1).name,ptr_00);
  }
  else {
    uVar1 = JavascriptStackWalker::GetByteCodeOffset(walker);
    (this->field_1).byteCodeOffset = uVar1;
  }
  ppFVar2 = Memory::WriteBarrierPtr::operator_cast_to_FunctionBody__((WriteBarrierPtr *)this);
  if ((*ppFVar2 != (FunctionBody *)0x0) && (initArgumentTypes)) {
    StackTraceArguments::Init(&this->argumentTypes,walker);
  }
  return;
}

Assistant:

JavascriptExceptionContext::StackFrame::StackFrame(JavascriptFunction* func, const JavascriptStackWalker& walker, bool initArgumentTypes)
    {
        this->functionBody = func->GetFunctionBody();

        if (this->functionBody)
        {
            this->byteCodeOffset = walker.GetByteCodeOffset();
        }
        else
        {
            this->name = walker.GetCurrentNativeLibraryEntryName();
        }

        if (this->functionBody && initArgumentTypes)
        {
            this->argumentTypes.Init(walker);
        }
    }